

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O2

double __thiscall Function::getYInput(Function *this)

{
  Function *pFVar1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  
  do {
    pFVar1 = this;
    if (pFVar1->eType == INPUT_Y) {
      (*(pFVar1->super_Physical)._vptr_Physical[0xc])();
      return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    }
    this = pFVar1->xLeft;
  } while (((pFVar1->xLeft != (Function *)0x0) ||
           (this = pFVar1->xRight, pFVar1->xRight != (Function *)0x0)) ||
          (this = pFVar1->xPlus, pFVar1->xPlus != (Function *)0x0));
  return 0.0;
}

Assistant:

double Function::getYInput()
{
	if (eType==INPUT_Y) {
		return getValue();
	}
	if (xLeft) return xLeft->getYInput();
	if (xRight) return xRight->getYInput();
	if (xPlus) return xPlus->getYInput();
	
	return 0.0;
}